

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

int resume_error(lua_State *L,char *msg,int narg)

{
  byte bVar1;
  int *piVar2;
  TString *pTVar3;
  char *__assertion;
  StkId pTVar4;
  
  pTVar4 = L->top + -(long)narg;
  L->top = pTVar4;
  pTVar3 = luaS_new(L,msg);
  if ((pTVar3->tt & 0xe) < 10) {
    (pTVar4->value_).gc = (GCObject *)pTVar3;
    bVar1 = pTVar3->tt;
    pTVar4->tt_ = bVar1 | 0x8000;
    if ((-1 < (char)bVar1) &&
       ((L == (lua_State *)0x0 || ((pTVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0)))) {
      pTVar4 = L->top;
      L->top = pTVar4 + 1;
      if (L->ci->top < pTVar4 + 1) {
        __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                      ,0x2cc,"int resume_error(lua_State *, const char *, int)");
      }
      piVar2 = *(int **)&L[-1].hookmask;
      *piVar2 = *piVar2 + -1;
      if (*piVar2 == 0) {
        return (int)piVar2;
      }
      __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x2cd,"int resume_error(lua_State *, const char *, int)");
    }
    __assertion = "0";
  }
  else {
    __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                ,0x2cb,"int resume_error(lua_State *, const char *, int)");
}

Assistant:

static int resume_error (lua_State *L, const char *msg, int narg) {
  L->top -= narg;  /* remove args from the stack */
  setsvalue2s(L, L->top, luaS_new(L, msg));  /* push error message */
  api_incr_top(L);
  lua_unlock(L);
  return LUA_ERRRUN;
}